

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void ossaddsb_input(osgen_txtwin_t *win,char *p,int add_nl)

{
  size_t len;
  ulong uVar1;
  int in_EDX;
  osgen_txtwin_t *in_RSI;
  long in_RDI;
  size_t cur;
  size_t wid_rem;
  size_t chars_rem;
  osgen_txtwin_t *in_stack_ffffffffffffffc8;
  ulong local_30;
  undefined4 in_stack_ffffffffffffffe8;
  
  for (len = strlen((char *)in_RSI); len != 0; len = len - local_30) {
    if ((int)*(undefined8 *)(in_RDI + 0x38) <= *(int *)(in_RDI + 0x48)) {
      osssb_new_line(in_stack_ffffffffffffffc8);
    }
    uVar1 = *(long *)(in_RDI + 0x38) - (long)*(int *)(in_RDI + 0x48);
    local_30 = len;
    if (uVar1 < len) {
      local_30 = uVar1;
    }
    ossaddsb(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),len,(int)(uVar1 >> 0x20));
    in_RSI = (osgen_txtwin_t *)((long)&(in_RSI->base).win_type + local_30);
  }
  if (in_EDX == 0) {
    osssb_add_safety_null((osgen_txtwin_t *)0x222e9f);
  }
  else {
    osssb_new_line(in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void ossaddsb_input(osgen_txtwin_t *win, char *p, int add_nl)
{
    size_t chars_rem;
    
    /* get the number of characters in the input to add */
    chars_rem = strlen(p);

    /* 
     *   add the input in chunks, wrapping whenever we reach the right edge
     *   of the window 
     */
    while (chars_rem != 0)
    {
        size_t wid_rem;
        size_t cur;
        
        /* if we're already past the edge, add a newline */
        if (win->base.x >= (int)win->base.wid)
            osssb_new_line(win);

        /* figure out how much space we have */
        wid_rem = win->base.wid - win->base.x;

        /* add as much as we can, up to the width remaining */
        cur = chars_rem;
        if (cur > wid_rem)
            cur = wid_rem;

        /* add the text */
        ossaddsb(win, p, cur, FALSE);

        /* skip this chunk */
        p += cur;
        chars_rem -= cur;
    }

    /* add a newline after the input if desired */
    if (add_nl)
        osssb_new_line(win);
    else
        osssb_add_safety_null(win);
}